

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

ON_SubDMeshFragment * __thiscall
ON_SubDHeap::AllocateMeshFragment
          (ON_SubDHeap *this,uint subd_display_density,ON_SubDMeshFragment *src_fragment)

{
  ON_SubDMeshFragment *pOVar1;
  ON_SubDMeshFragment *pOVar2;
  ON_SubDMeshFragment *pOVar3;
  ON_SubDMeshFragment *pOVar4;
  ON_SubDMeshFragment *pOVar5;
  bool bVar6;
  uint uVar7;
  size_t sVar8;
  size_t *psVar9;
  ON_SubDMeshFragment *pOVar10;
  size_t sVar11;
  long lVar12;
  ON_SubDMeshFragment *pOVar13;
  long lVar14;
  ON_SubDMeshFragment *this_01;
  uint display_density;
  uint uVar15;
  ON_SleepLockGuard guard;
  ON_SleepLockGuard local_40;
  ON_FixedSizePool *this_00;
  
  if (6 < subd_display_density) goto LAB_00613ed9;
  display_density = 0xffffffff;
  if (src_fragment->m_face_fragment_count == 1) {
    display_density = subd_display_density;
  }
  if (1 < src_fragment->m_face_fragment_count) {
    display_density = subd_display_density - 1;
  }
  if (display_density == 0xffffffff) goto LAB_00613ed9;
  uVar7 = ON_SubDMeshFragment::SideSegmentCountFromDisplayDensity(display_density);
  uVar15 = (uVar7 + 1) * (uVar7 + 1);
  uVar7 = ON_SubDMeshFragment::VertexCount(src_fragment);
  if ((uVar7 != 0) &&
     (uVar7 = ON_SubDMeshFragment::VertexCount(src_fragment), uVar7 < (uVar15 & 0xfffd)))
  goto LAB_00613ed9;
  uVar7 = this->m_full_fragment_display_density;
  if (uVar7 == 0) {
    bVar6 = Internal_InitializeFragmentCountEstimates(this,subd_display_density);
    if (!bVar6) goto LAB_00613ed9;
    uVar7 = this->m_full_fragment_display_density;
  }
  if (uVar7 - 6 < 0xfffffffb) goto LAB_00613ed9;
  lVar12 = 600;
  if (display_density + 1 == uVar7) {
    lVar12 = 0x210;
  }
  lVar14 = 0x1c8;
  if (display_density != uVar7) {
    lVar14 = lVar12;
  }
  this_00 = (ON_FixedSizePool *)((long)&this->m_ws + lVar14);
  sVar8 = ON_FixedSizePool::SizeofElement(this_00);
  if (sVar8 != 0) goto LAB_00613f8c;
  if (display_density == uVar7) {
    uVar7 = this->m_full_fragment_display_density;
    lVar12 = 0x1bc;
LAB_00613f4c:
    sVar11 = (size_t)*(uint *)((long)&this->m_ws + lVar12);
    psVar9 = g_sizeof_fragment + uVar7;
    sVar8 = 0x20;
  }
  else {
    if (display_density + 1 == uVar7) {
      uVar7 = this->m_full_fragment_display_density - 1;
      lVar12 = 0x1c0;
      goto LAB_00613f4c;
    }
    psVar9 = g_sizeof_fragment + 6;
    sVar8 = 1;
    sVar11 = 4;
  }
  bVar6 = Internal_InitializeMeshFragmentPool(*psVar9,sVar11,sVar8,this_00);
  if (bVar6) {
LAB_00613f8c:
    ON_SleepLockGuard::ON_SleepLockGuard(&local_40,this_00);
    this_01 = (ON_SubDMeshFragment *)this->m_unused_fragments[display_density];
    if (this_01 == (ON_SubDMeshFragment *)0x0) {
      pOVar10 = (ON_SubDMeshFragment *)ON_FixedSizePool::AllocateDirtyElement(this_00);
      if (pOVar10 == (ON_SubDMeshFragment *)0x0) {
        ON_SubDIncrementErrorCount();
        ON_SleepLockGuard::~ON_SleepLockGuard(&local_40);
        return (ON_SubDMeshFragment *)0x0;
      }
      sVar11 = ON_FixedSizePool::SizeofElement(this_00);
      this->m_unused_fragments[display_density] = (ON_FixedSizePoolElement *)pOVar10;
      pOVar10->m_reserved = 0;
      sVar8 = g_sizeof_fragment[display_density];
      pOVar13 = (ON_SubDMeshFragment *)((long)pOVar10->m_face_vertex_index + (sVar8 - 0x10));
      this_01 = (ON_SubDMeshFragment *)this->m_unused_fragments[display_density];
      pOVar1 = (ON_SubDMeshFragment *)((long)pOVar13->m_face_vertex_index + (sVar8 - 0x10));
      pOVar3 = pOVar1;
      pOVar4 = this_01;
      pOVar5 = pOVar10;
      while (pOVar2 = pOVar13,
            pOVar1 <= (ON_SubDMeshFragment *)((long)pOVar10->m_face_vertex_index + (sVar11 - 0x10)))
      {
        *(ON_SubDMeshFragment **)((long)pOVar5->m_face_vertex_index + (sVar8 - 0x10)) = pOVar4;
        this_01 = (ON_SubDMeshFragment *)((long)pOVar5->m_face_vertex_index + (sVar8 - 0x10));
        this->m_unused_fragments[display_density] = (ON_FixedSizePoolElement *)this_01;
        pOVar13 = pOVar3;
        pOVar3 = (ON_SubDMeshFragment *)((long)pOVar3->m_face_vertex_index + (sVar8 - 0x10));
        pOVar4 = pOVar2;
        pOVar5 = this_01;
        pOVar1 = (ON_SubDMeshFragment *)(this_01->m_face_vertex_index + (sVar8 - 8));
      }
    }
    this->m_unused_fragments[display_density] = (ON_FixedSizePoolElement *)this_01->m_reserved;
    ON_SleepLockGuard::~ON_SleepLockGuard(&local_40);
    memcpy(this_01,&ON_SubDMeshFragment::Empty,0x248);
    this_01->m_next_fragment = (ON_SubDMeshFragment *)0x0;
    this_01->m_prev_fragment = (ON_SubDMeshFragment *)0x0;
    ON_SubDMeshFragment::Internal_LayoutArrays
              (this_01,(ulong)(uVar15 & 0xfffd),(double *)(this_01 + 1));
    uVar7 = ON_SubDMeshFragment::VertexCount(src_fragment);
    if (uVar7 != 0) {
      ON_SubDMeshFragment::CopyFrom(this_01,src_fragment,display_density);
      return this_01;
    }
    return this_01;
  }
LAB_00613ed9:
  ON_SubDIncrementErrorCount();
  return (ON_SubDMeshFragment *)0x0;
}

Assistant:

ON_SubDMeshFragment* ON_SubDHeap::AllocateMeshFragment(
  unsigned subd_display_density,
  const ON_SubDMeshFragment& src_fragment
)
{
  if (subd_display_density > ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(nullptr);

  // When 4 == ON_SubDDisplayParameters::DefaultDensity (setting used in February 2019)
  // quads get a single fragment with a 16x16 face grid
  // N-gons with N != 4 get N 8x8 grids.

  // density = density of src_fragment
  const unsigned int density = (src_fragment.m_face_fragment_count > 1)
    ? ((subd_display_density > 0) ? (subd_display_density -1) : ON_UNSET_UINT_INDEX)
    : ((1==src_fragment.m_face_fragment_count) ? subd_display_density : ON_UNSET_UINT_INDEX)
    ;
  if (ON_UNSET_UINT_INDEX == density)
    return ON_SUBD_RETURN_ERROR(nullptr);
  const unsigned count = (unsigned)(sizeof(m_unused_fragments) / sizeof(m_unused_fragments[0]));
  if (density >= count)
    return ON_SUBD_RETURN_ERROR(nullptr);

  const unsigned short side_seg_count = (unsigned short)ON_SubDMeshFragment::SideSegmentCountFromDisplayDensity(density);
  const unsigned short vertex_capacity = (side_seg_count + 1)*(side_seg_count + 1);
  if ( src_fragment.VertexCount() > 0 && src_fragment.VertexCount() < ((unsigned)vertex_capacity) )
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (0 == m_full_fragment_display_density)
  {
    // Lazy initialization of m_full_fragment_display_density is done because
    // we don't know the display density when SubDs are being constructed.
    if (false == Internal_InitializeFragmentCountEstimates(subd_display_density))
      return ON_SUBD_RETURN_ERROR(nullptr);
  }
  if (m_full_fragment_display_density <= 0 || m_full_fragment_display_density >= ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(nullptr);

  // In all common situations, bUseFullFragmentFSP or bUsePartFragmentFSP is true.
  const bool bUseFullFragmentFSP = (density == this->m_full_fragment_display_density);
  const bool bUsePartFragmentFSP = (density+1 == this->m_full_fragment_display_density);

  ON_FixedSizePool& fsp 
    = bUseFullFragmentFSP
    ? m_fsp_full_fragments
    : bUsePartFragmentFSP ? m_fsp_part_fragments : m_fsp_oddball_fragments;

  if (0 == fsp.SizeofElement())
  {
    // Lazy initialization of the fragment fixed size pools
    // is done so that we don't reserve pool memory that never gets used.

    const size_t sizeof_fragment
      = bUseFullFragmentFSP
      ? ON_SubDHeap::g_sizeof_fragment[m_full_fragment_display_density]
      : (bUsePartFragmentFSP ? ON_SubDHeap::g_sizeof_fragment[m_full_fragment_display_density - 1U] : ON_SubDHeap::g_sizeof_fragment[ON_SubDDisplayParameters::MaximumDensity])
      ;

    const size_t fragment_count_estimate
      = bUseFullFragmentFSP
      ? m_full_fragment_count_estimate
      : (bUsePartFragmentFSP ? m_part_fragment_count_estimate : ((unsigned)4U))
      ;

    const size_t min_fsp_2nd_block_element_count = (bUseFullFragmentFSP || bUsePartFragmentFSP) ? 32 : 1;

    if (false == this->Internal_InitializeMeshFragmentPool(
      sizeof_fragment,
      fragment_count_estimate,
      min_fsp_2nd_block_element_count,
      fsp
    ))
    {
      return ON_SUBD_RETURN_ERROR(nullptr);
    }
  }

  ON_SubDMeshFragment* fragment;
  {
    char* p = nullptr;
    char* p1 = nullptr;
    ON_SleepLockGuard guard(fsp);
    if (nullptr == m_unused_fragments[density])
    {
      p = (char*)fsp.AllocateDirtyElement();
      if (nullptr == p)
        return ON_SUBD_RETURN_ERROR(nullptr);
      p1 = p + fsp.SizeofElement();
      m_unused_fragments[density] = (ON_FixedSizePoolElement*)p;
      m_unused_fragments[density]->m_next = nullptr;
      const size_t sizeof_fragment = ON_SubDHeap::g_sizeof_fragment[density];
      for (p += sizeof_fragment; p + sizeof_fragment <= p1; p += sizeof_fragment)
      {
        // This loop is rarely executed.
        // It is used when an unusual small fragment is allocated from a pool
        // providing large fragments (fsp.SizeofElement() > sizeof_fragment).
        // If fsp.SizeofElement() is not an even multiple of sizeof_fragment,
        // then some memory is wasted. Because this situation is uncommon,
        // the waste doesn't matter in the big scheme of things.
        ON_FixedSizePoolElement* ele = (ON_FixedSizePoolElement*)p;
        ele->m_next = m_unused_fragments[density];
        m_unused_fragments[density] = ele;          
      }
    }
    fragment = (ON_SubDMeshFragment*)m_unused_fragments[density];
    m_unused_fragments[density] = m_unused_fragments[density]->m_next;
  }

  // NO // *fragment = src_fragment;
  *fragment = ON_SubDMeshFragment::Empty;
  fragment->m_prev_fragment = nullptr;
  fragment->m_next_fragment = nullptr;

  // NOTE WELL:
  //   fragment and fragment array memory are from a single fixed size pool allocation.
  fragment->Internal_LayoutArrays(vertex_capacity, (double*)(fragment + 1) );

  if (src_fragment.VertexCount() > 0)
    fragment->CopyFrom(src_fragment,density);

  return fragment;
}